

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::find_unit_abi_cxx11_(unit un)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> __s;
  _Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> __a;
  string *in_RDI;
  const_iterator fnd;
  iterator fndud;
  unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
  *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  allocator<char> local_31;
  _Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> in_stack_ffffffffffffffd8;
  _Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  in_stack_ffffffffffffffe0;
  _Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_18 [3];
  
  bVar1 = std::atomic<bool>::load
                    ((atomic<bool> *)in_RDI,(memory_order)((ulong)in_stack_ffffffffffffffa0 >> 0x20)
                    );
  if ((bVar1) &&
     (bVar1 = std::
              unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)0x6c14ee), !bVar1)) {
    local_18[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_ffffffffffffff98,(key_type *)0x6c1503);
    in_stack_ffffffffffffffe0._M_cur =
         (__node_type *)
         std::
         unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff98);
    bVar1 = std::__detail::operator==
                      (local_18,(_Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                 *)&stack0xffffffffffffffe0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::__detail::
      _Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                    *)0x6c153a);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffe0._M_cur,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffd8._M_cur);
      return in_RDI;
    }
  }
  __s._M_cur = (__node_type *)
               std::
               unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
               ::find(in_stack_ffffffffffffff98,(key_type *)0x6c1565);
  __a._M_cur = (__node_type *)
               std::
               unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
               ::end(in_stack_ffffffffffffff98);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> *)
                     &stack0xffffffffffffffd8,
                     (_Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> *)
                     &stack0xffffffffffffffd0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  }
  else {
    std::__detail::_Node_const_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true>::
    operator->((_Node_const_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true> *)
               0x6c159c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffe0._M_cur,(char *)__s._M_cur,(allocator<char> *)__a._M_cur);
    std::allocator<char>::~allocator(&local_31);
  }
  return in_RDI;
}

Assistant:

static std::string find_unit(unit un)
{  // cppcheck suppression active
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        if (!user_defined_unit_names.empty()) {
            auto fndud = user_defined_unit_names.find(un);
            if (fndud != user_defined_unit_names.end()) {
                return fndud->second;
            }
        }
    }
    auto fnd = base_unit_names.find(un);
    if (fnd != base_unit_names.end()) {
        return fnd->second;
    }
    return std::string{};
}